

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntru.c
# Opt level: O0

void ntru_session_hash(uint8_t *out,uint ok,uint16_t *plaintext,uint p,ptrlen ciphertext,
                      ptrlen confirmation_hash)

{
  ssh_hash *h;
  ssh_hash *h_00;
  ssh_hash *h3r;
  uint8_t hashdata [64];
  ssh_hash *hsession;
  uint p_local;
  uint16_t *plaintext_local;
  uint ok_local;
  uint8_t *out_local;
  ptrlen ciphertext_local;
  
  h = ssh_hash_new(&ssh_sha512);
  BinarySink_put_byte(h->binarysink_,(uchar)ok);
  h_00 = ssh_hash_new(&ssh_sha512);
  BinarySink_put_byte(h_00->binarysink_,'\x03');
  ntru_encode_plaintext(plaintext,p,h_00->binarysink_);
  ssh_hash_final(h_00,(uchar *)&h3r);
  BinarySink_put_data(h->binarysink_,&h3r,0x20);
  BinarySink_put_datapl(h->binarysink_,ciphertext);
  BinarySink_put_datapl(h->binarysink_,confirmation_hash);
  ssh_hash_final(h,(uchar *)&h3r);
  *(ssh_hash **)out = h3r;
  *(undefined8 *)(out + 8) = hashdata._0_8_;
  *(undefined8 *)(out + 0x10) = hashdata._8_8_;
  *(undefined8 *)(out + 0x18) = hashdata._16_8_;
  smemclr(&h3r,0x40);
  return;
}

Assistant:

void ntru_session_hash(uint8_t *out, unsigned ok, const uint16_t *plaintext,
                       unsigned p, ptrlen ciphertext, ptrlen confirmation_hash)
{
    /* The outer hash object */
    ssh_hash *hsession = ssh_hash_new(&ssh_sha512);
    put_byte(hsession, ok);            /* initial byte 1 or 0 */

    uint8_t hashdata[64];

    /* Compute H(3 || r), or maybe H(3 || rho), and add it to the main hash */
    ssh_hash *h3r = ssh_hash_new(&ssh_sha512);
    put_byte(h3r, 3);
    ntru_encode_plaintext(plaintext, p, BinarySink_UPCAST(h3r));
    ssh_hash_final(h3r, hashdata);
    put_data(hsession, hashdata, 32);

    /* Put the ciphertext and confirmation hash in */
    put_datapl(hsession, ciphertext);
    put_datapl(hsession, confirmation_hash);

    /* Compute the full output of the main SHA-512 hash */
    ssh_hash_final(hsession, hashdata);

    /* And copy the first 32 bytes into the caller's output array */
    memcpy(out, hashdata, 32);
    smemclr(hashdata, sizeof(hashdata));
}